

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIOS.cxx
# Opt level: O0

int testIOS(int param_1,char **param_2)

{
  undefined8 uVar1;
  bool bVar2;
  _Ios_Iostate _Var3;
  _Ios_Iostate _Var4;
  _Ios_Openmode _Var5;
  long lVar6;
  ostream *poVar7;
  long *plVar8;
  istream *piVar9;
  undefined1 local_aa8 [8];
  ifstream fin;
  stringstream local_8a0 [8];
  stringstream sstr;
  ostream local_890 [383];
  allocator local_711;
  string local_710 [36];
  int local_6ec;
  undefined1 local_6e8 [4];
  int x;
  string s;
  string local_6c0 [32];
  long local_6a0;
  istringstream istr;
  string local_520 [32];
  stringstream local_500 [8];
  stringstream strstr;
  char local_4f0 [376];
  undefined8 local_378;
  size_t narray;
  ostringstream local_350 [8];
  ostringstream ostr2;
  undefined4 local_1d4;
  undefined2 local_1d0;
  char world [6];
  char local_198 [8];
  char hello [6];
  ostringstream ostr;
  char **param_2_local;
  int param_1_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)hello);
  builtin_strncpy(local_198,"hello",6);
  std::operator<<((ostream *)hello,local_198);
  std::__cxx11::ostringstream::str();
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (world + 4),local_198);
  std::__cxx11::string::~string((string *)(world + 4));
  if (bVar2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"failed to write hello to ostr");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    param_2_local._4_4_ = 1;
    world[0] = '\x01';
    world[1] = '\0';
    world[2] = '\0';
    world[3] = '\0';
  }
  else {
    local_1d0 = 100;
    local_1d4 = 0x6c726f77;
    std::__cxx11::ostringstream::ostringstream(local_350);
    std::ostream::write((char *)local_350,(long)local_198);
    std::ostream::put((char)local_350);
    std::ostream::write((char *)local_350,(long)&local_1d4);
    std::__cxx11::ostringstream::str();
    lVar6 = std::__cxx11::string::size();
    std::__cxx11::string::~string((string *)&narray);
    if (lVar6 == 0xb) {
      local_378 = 0xb4;
      std::__cxx11::stringstream::stringstream(local_500);
      std::ostream::write(local_4f0,0x17f530);
      std::__cxx11::stringstream::str();
      lVar6 = std::__cxx11::string::size();
      std::__cxx11::string::~string(local_520);
      if (lVar6 == 0xb4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_6c0," 10 20 str ",(allocator *)(s.field_2._M_local_buf + 0xf));
        std::__cxx11::istringstream::istringstream((istringstream *)&local_6a0,local_6c0,_S_in);
        std::__cxx11::string::~string(local_6c0);
        std::allocator<char>::~allocator((allocator<char> *)(s.field_2._M_local_buf + 0xf));
        std::__cxx11::string::string((string *)local_6e8);
        plVar8 = (long *)std::istream::operator>>(&local_6a0,&local_6ec);
        bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
        if (bVar2) {
          if (local_6ec == 10) {
            plVar8 = (long *)std::istream::operator>>(&local_6a0,&local_6ec);
            bVar2 = std::ios::operator_cast_to_bool
                              ((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
            if (bVar2) {
              if (local_6ec == 0x14) {
                piVar9 = std::operator>>((istream *)&local_6a0,(string *)local_6e8);
                bVar2 = std::ios::operator_cast_to_bool
                                  ((ios *)(piVar9 + *(long *)(*(long *)piVar9 + -0x18)));
                if (bVar2) {
                  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_6e8,"str");
                  if (bVar2) {
                    poVar7 = std::operator<<((ostream *)&std::cerr,"s != \"str\"");
                    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                    param_2_local._4_4_ = 1;
                    world[0] = '\x01';
                    world[1] = '\0';
                    world[2] = '\0';
                    world[3] = '\0';
                  }
                  else {
                    piVar9 = std::operator>>((istream *)&local_6a0,(string *)local_6e8);
                    bVar2 = std::ios::operator_cast_to_bool
                                      ((ios *)(piVar9 + *(long *)(*(long *)piVar9 + -0x18)));
                    if (bVar2) {
                      poVar7 = std::operator<<((ostream *)&std::cerr,
                                               "Able to read past end of stream");
                      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                      param_2_local._4_4_ = 1;
                      world[0] = '\x01';
                      world[1] = '\0';
                      world[2] = '\0';
                      world[3] = '\0';
                    }
                    else {
                      uVar1 = *(undefined8 *)(local_6a0 + -0x18);
                      _Var3 = std::ios::rdstate();
                      _Var4 = std::operator~(_S_eofbit);
                      std::operator&(_Var3,_Var4);
                      std::ios::clear((int)&local_6a0 + (int)uVar1);
                      uVar1 = *(undefined8 *)(local_6a0 + -0x18);
                      _Var3 = std::ios::rdstate();
                      _Var4 = std::operator~(_S_failbit);
                      std::operator&(_Var3,_Var4);
                      std::ios::clear((int)&local_6a0 + (int)uVar1);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_710,"30",&local_711);
                      std::__cxx11::istringstream::str((string *)&local_6a0);
                      std::__cxx11::string::~string(local_710);
                      std::allocator<char>::~allocator((allocator<char> *)&local_711);
                      plVar8 = (long *)std::istream::operator>>(&local_6a0,&local_6ec);
                      bVar2 = std::ios::operator_cast_to_bool
                                        ((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
                      if (bVar2) {
                        if (local_6ec == 0x1e) {
                          std::__cxx11::stringstream::stringstream(local_8a0);
                          std::operator<<(local_890,"40 str2");
                          plVar8 = (long *)std::istream::operator>>(local_8a0,&local_6ec);
                          bVar2 = std::ios::operator_cast_to_bool
                                            ((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
                          if (bVar2) {
                            if (local_6ec == 0x28) {
                              piVar9 = std::operator>>((istream *)local_8a0,(string *)local_6e8);
                              bVar2 = std::ios::operator_cast_to_bool
                                                ((ios *)(piVar9 + *(long *)(*(long *)piVar9 + -0x18)
                                                        ));
                              if (bVar2) {
                                bVar2 = std::operator!=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_6e8,"str2");
                                if (bVar2) {
                                  poVar7 = std::operator<<((ostream *)&std::cerr,"s != \"str2\"");
                                  std::ostream::operator<<
                                            (poVar7,std::endl<char,std::char_traits<char>>);
                                  param_2_local._4_4_ = 1;
                                }
                                else {
                                  if (local_6ec == 0x3039) {
                                    _Var5 = std::operator|(_S_in,_S_bin);
                                    std::ifstream::ifstream(local_aa8,"/does_not_exist",_Var5);
                                    std::ifstream::~ifstream(local_aa8);
                                  }
                                  poVar7 = std::operator<<((ostream *)&std::cout,"IOS tests passed")
                                  ;
                                  std::ostream::operator<<
                                            (poVar7,std::endl<char,std::char_traits<char>>);
                                  param_2_local._4_4_ = 0;
                                }
                              }
                              else {
                                poVar7 = std::operator<<((ostream *)&std::cerr,
                                                         "Failed to read str2 from sstr");
                                std::ostream::operator<<
                                          (poVar7,std::endl<char,std::char_traits<char>>);
                                param_2_local._4_4_ = 1;
                              }
                            }
                            else {
                              poVar7 = std::operator<<((ostream *)&std::cerr,"x != 40");
                              std::ostream::operator<<
                                        (poVar7,std::endl<char,std::char_traits<char>>);
                              param_2_local._4_4_ = 1;
                            }
                          }
                          else {
                            poVar7 = std::operator<<((ostream *)&std::cerr,
                                                     "Failed to read 40 from sstr");
                            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                            param_2_local._4_4_ = 1;
                          }
                          world[0] = '\x01';
                          world[1] = '\0';
                          world[2] = '\0';
                          world[3] = '\0';
                          std::__cxx11::stringstream::~stringstream(local_8a0);
                        }
                        else {
                          poVar7 = std::operator<<((ostream *)&std::cerr,"x != 30");
                          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                          param_2_local._4_4_ = 1;
                          world[0] = '\x01';
                          world[1] = '\0';
                          world[2] = '\0';
                          world[3] = '\0';
                        }
                      }
                      else {
                        poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to read 30 from istr"
                                                );
                        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                        param_2_local._4_4_ = 1;
                        world[0] = '\x01';
                        world[1] = '\0';
                        world[2] = '\0';
                        world[3] = '\0';
                      }
                    }
                  }
                }
                else {
                  poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to read str from istr");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  param_2_local._4_4_ = 1;
                  world[0] = '\x01';
                  world[1] = '\0';
                  world[2] = '\0';
                  world[3] = '\0';
                }
              }
              else {
                poVar7 = std::operator<<((ostream *)&std::cerr,"x != 20");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                param_2_local._4_4_ = 1;
                world[0] = '\x01';
                world[1] = '\0';
                world[2] = '\0';
                world[3] = '\0';
              }
            }
            else {
              poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to read 20 from istr");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              param_2_local._4_4_ = 1;
              world[0] = '\x01';
              world[1] = '\0';
              world[2] = '\0';
              world[3] = '\0';
            }
          }
          else {
            poVar7 = std::operator<<((ostream *)&std::cerr,"x != 10");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            param_2_local._4_4_ = 1;
            world[0] = '\x01';
            world[1] = '\0';
            world[2] = '\0';
            world[3] = '\0';
          }
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to read 10 from istr");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          param_2_local._4_4_ = 1;
          world[0] = '\x01';
          world[1] = '\0';
          world[2] = '\0';
          world[3] = '\0';
        }
        std::__cxx11::string::~string((string *)local_6e8);
        std::__cxx11::istringstream::~istringstream((istringstream *)&local_6a0);
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cerr,"failed to write array to strstr");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        param_2_local._4_4_ = 1;
        world[0] = '\x01';
        world[1] = '\0';
        world[2] = '\0';
        world[3] = '\0';
      }
      std::__cxx11::stringstream::~stringstream(local_500);
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cerr,"failed to write hello to ostr2");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      param_2_local._4_4_ = 1;
      world[0] = '\x01';
      world[1] = '\0';
      world[2] = '\0';
      world[3] = '\0';
    }
    std::__cxx11::ostringstream::~ostringstream(local_350);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)hello);
  return param_2_local._4_4_;
}

Assistant:

int testIOS(int, char* [])
{
  std::ostringstream ostr;
  const char hello[] = "hello";
  ostr << hello;
  if (ostr.str() != hello) {
    std::cerr << "failed to write hello to ostr" << std::endl;
    return 1;
  }
  const char world[] = "world";
  std::ostringstream ostr2;
  ostr2.write(hello, strlen(hello)); /* I could do sizeof */
  ostr2.put('\0');
  ostr2.write(world, strlen(world));
  if (ostr2.str().size() != strlen(hello) + 1 + strlen(world)) {
    std::cerr << "failed to write hello to ostr2" << std::endl;
    return 1;
  }
  static const unsigned char array[] = {
    0xff, 0x4f, 0xff, 0x51, 0x00, 0x29, 0x00, 0x00, 0x00, 0x00, 0x00, 0x30,
    0x00, 0x00, 0x00, 0x3e, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
    0x00, 0x00, 0x00, 0x30, 0x00, 0x00, 0x00, 0x3e, 0x00, 0x00, 0x00, 0x00,
    0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x07, 0x01, 0x01, 0xff, 0x52, 0x00,
    0x0c, 0x00, 0x00, 0x00, 0x01, 0x00, 0x05, 0x04, 0x04, 0x00, 0x01, 0xff,
    0x5c, 0x00, 0x13, 0x40, 0x40, 0x48, 0x48, 0x50, 0x48, 0x48, 0x50, 0x48,
    0x48, 0x50, 0x48, 0x48, 0x50, 0x48, 0x48, 0x50, 0xff, 0x64, 0x00, 0x2c,
    0x00, 0x00, 0x43, 0x72, 0x65, 0x61, 0x74, 0x65, 0x64, 0x20, 0x62, 0x79,
    0x20, 0x49, 0x54, 0x4b, 0x2f, 0x47, 0x44, 0x43, 0x4d, 0x2f, 0x4f, 0x70,
    0x65, 0x6e, 0x4a, 0x50, 0x45, 0x47, 0x20, 0x76, 0x65, 0x72, 0x73, 0x69,
    0x6f, 0x6e, 0x20, 0x31, 0x2e, 0x30, 0xff, 0x90, 0x00, 0x0a, 0x00, 0x00,
    0x00, 0x00, 0x06, 0x2c, 0x00, 0x01, 0xff, 0x93, 0xcf, 0xb0, 0x18, 0x08,
    0x7f, 0xc6, 0x99, 0xbf, 0xff, 0xc0, 0xf8, 0xc1, 0xc1, 0xf3, 0x05, 0x81,
    0xf2, 0x83, 0x0a, 0xa5, 0xff, 0x10, 0x90, 0xbf, 0x2f, 0xff, 0x04, 0xa8,
    0x7f, 0xc0, 0xf8, 0xc4, 0xc1, 0xf3, 0x09, 0x81, 0xf3, 0x0c, 0x19, 0x34
  };
  const size_t narray = sizeof(array); // 180
  std::stringstream strstr;
  strstr.write((char*)array, narray);
  // strstr.seekp( narray / 2 ); // set position of put pointer in mid string
  if (strstr.str().size() != narray) {
    std::cerr << "failed to write array to strstr" << std::endl;
    return 1;
  }

  std::istringstream istr(" 10 20 str ");
  std::string s;
  int x;
  if (istr >> x) {
    if (x != 10) {
      std::cerr << "x != 10" << std::endl;
      return 1;
    }
  } else {
    std::cerr << "Failed to read 10 from istr" << std::endl;
    return 1;
  }
  if (istr >> x) {
    if (x != 20) {
      std::cerr << "x != 20" << std::endl;
      return 1;
    }
  } else {
    std::cerr << "Failed to read 20 from istr" << std::endl;
    return 1;
  }
  if (istr >> s) {
    if (s != "str") {
      std::cerr << "s != \"str\"" << std::endl;
      return 1;
    }
  } else {
    std::cerr << "Failed to read str from istr" << std::endl;
    return 1;
  }
  if (istr >> s) {
    std::cerr << "Able to read past end of stream" << std::endl;
    return 1;
  } else {
    // Clear the failure.
    istr.clear(istr.rdstate() & ~std::ios::eofbit);
    istr.clear(istr.rdstate() & ~std::ios::failbit);
  }
  istr.str("30");
  if (istr >> x) {
    if (x != 30) {
      std::cerr << "x != 30" << std::endl;
      return 1;
    }
  } else {
    std::cerr << "Failed to read 30 from istr" << std::endl;
    return 1;
  }

  std::stringstream sstr;
  sstr << "40 str2";
  if (sstr >> x) {
    if (x != 40) {
      std::cerr << "x != 40" << std::endl;
      return 1;
    }
  } else {
    std::cerr << "Failed to read 40 from sstr" << std::endl;
    return 1;
  }
  if (sstr >> s) {
    if (s != "str2") {
      std::cerr << "s != \"str2\"" << std::endl;
      return 1;
    }
  } else {
    std::cerr << "Failed to read str2 from sstr" << std::endl;
    return 1;
  }

  // Just try to compile this.
  if (x == 12345) {
    std::ifstream fin("/does_not_exist", std::ios::in | std::ios::binary);
  }

  std::cout << "IOS tests passed" << std::endl;
  return 0;
}